

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O2

void __thiscall discordpp::RoleTags::RoleTags(RoleTags *this,RoleTags *param_1)

{
  omittable_field<discordpp::Snowflake>::omittable_field(&this->bot_id,&param_1->bot_id);
  omittable_field<discordpp::Snowflake>::omittable_field
            (&this->integration_id,&param_1->integration_id);
  omittable_field<std::nullptr_t>::omittable_field
            (&this->premium_subscriber,&param_1->premium_subscriber);
  omittable_field<discordpp::Snowflake>::omittable_field
            (&this->subscription_listing_id,&param_1->subscription_listing_id);
  omittable_field<std::nullptr_t>::omittable_field
            (&this->available_for_purchase,&param_1->available_for_purchase);
  omittable_field<std::nullptr_t>::omittable_field
            (&this->guild_connections,&param_1->guild_connections);
  return;
}

Assistant:

RoleTags(
        omittable_field<Snowflake> bot_id = omitted,
        omittable_field<Snowflake> integration_id = omitted,
        omittable_field<std::nullptr_t> premium_subscriber = omitted,
        omittable_field<Snowflake> subscription_listing_id = omitted,
        omittable_field<std::nullptr_t> available_for_purchase = omitted,
        omittable_field<std::nullptr_t> guild_connections = omitted
    ):
        bot_id(bot_id),
        integration_id(integration_id),
        premium_subscriber(premium_subscriber),
        subscription_listing_id(subscription_listing_id),
        available_for_purchase(available_for_purchase),
        guild_connections(guild_connections)
    {}